

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

int aom_vector_push_back(Vector *vector,void *element)

{
  size_t sVar1;
  void *__src;
  void *__dest;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = vector->size;
  if (uVar3 == vector->capacity) {
    sVar2 = uVar3 * 2;
    if (sVar2 == 0) {
      if (uVar3 < 3) goto LAB_0022ad9e;
      sVar2 = 2;
    }
    sVar1 = vector->element_size;
    __src = vector->data;
    __dest = malloc(sVar1 * sVar2);
    vector->data = __dest;
    if (__dest == (void *)0x0) {
      return -1;
    }
    memcpy(__dest,__src,sVar1 * uVar3);
    vector->capacity = sVar2;
    free(__src);
    uVar3 = vector->size;
  }
LAB_0022ad9e:
  memcpy((void *)(uVar3 * vector->element_size + (long)vector->data),element,vector->element_size);
  vector->size = vector->size + 1;
  return 0;
}

Assistant:

int aom_vector_push_back(Vector *vector, void *element) {
  assert(vector != NULL);
  assert(element != NULL);

  if (_vector_should_grow(vector)) {
    if (_vector_adjust_capacity(vector) == VECTOR_ERROR) {
      return VECTOR_ERROR;
    }
  }

  _vector_assign(vector, vector->size, element);

  ++vector->size;

  return VECTOR_SUCCESS;
}